

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computationTest.cpp
# Opt level: O0

void __thiscall Computation_FG_Test::TestBody(Computation_FG_Test *this)

{
  bool bVar1;
  double **F_00;
  double **G_00;
  double **RHS;
  char *pcVar2;
  double dVar3;
  undefined8 in_stack_fffffffffffffe68;
  double *pdVar4;
  int sizeX;
  double ***in_stack_fffffffffffffe70;
  double ***in_stack_fffffffffffffe78;
  double ***in_stack_fffffffffffffe80;
  AssertionResult *this_00;
  AssertHelper in_stack_fffffffffffffec8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffed0;
  double **in_stack_fffffffffffffed8;
  double **in_stack_fffffffffffffee0;
  AssertionResult gtest_ar_2;
  Message local_108;
  fluidSim *in_stack_ffffffffffffff00;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  Message local_e0 [3];
  double local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  int j;
  int i;
  double errRHS;
  double errG;
  double errF;
  fluidSim sim;
  char **FLAG;
  double **rhs;
  double **G;
  double **F;
  double init [3];
  Computation_FG_Test *this_local;
  
  initUVP(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
          (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),(int)in_stack_fffffffffffffe68,
          (double *)0x1191b0);
  F_00 = create2Dfield((int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                       (int)in_stack_fffffffffffffe78);
  G_00 = create2Dfield((int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                       (int)in_stack_fffffffffffffe78);
  RHS = create2Dfield((int)((ulong)in_stack_fffffffffffffe78 >> 0x20),(int)in_stack_fffffffffffffe78
                     );
  sim._64_8_ = create2DIntegerField
                         ((int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                          (int)in_stack_fffffffffffffe78);
  errF = 1000.0;
  sim.dt = 0.0;
  sim.GX = 0.0;
  sim.omega = 0.0;
  pdVar4 = &errF;
  compFG((double **)gtest_ar_2.message_.ptr_,(double **)gtest_ar_2._0_8_,in_stack_fffffffffffffee0,
         in_stack_fffffffffffffed8,(char **)in_stack_fffffffffffffed0.ptr_,
         (double)in_stack_fffffffffffffec8.data_,(lattice *)this,in_stack_ffffffffffffff00);
  compRHS(F_00,G_00,RHS,(lattice *)&((lattice *)this)->imax,0.5);
  errG = 0.0;
  errRHS = 0.0;
  _j = 0.0;
  for (gtest_ar.message_.ptr_._4_4_ = 1; sizeX = (int)((ulong)pdVar4 >> 0x20),
      gtest_ar.message_.ptr_._4_4_ <= *(int *)&((lattice *)((long)this + 0x30))->delx;
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    for (gtest_ar.message_.ptr_._0_4_ = 1;
        (int)gtest_ar.message_.ptr_ <= *(int *)((long)&((lattice *)((long)this + 0x30))->delx + 4);
        gtest_ar.message_.ptr_._0_4_ = (int)gtest_ar.message_.ptr_ + 1) {
      dVar3 = sqr(F_00[gtest_ar.message_.ptr_._4_4_ + -1][(int)gtest_ar.message_.ptr_] -
                  *(double *)
                   (*(long *)(*(long *)&((lattice *)((long)this + 0x30))->il +
                             (long)gtest_ar.message_.ptr_._4_4_ * 8) +
                   (long)(int)gtest_ar.message_.ptr_ * 8));
      errG = dVar3 + errG;
      dVar3 = sqr(G_00[gtest_ar.message_.ptr_._4_4_][(int)gtest_ar.message_.ptr_ + -1] -
                  *(double *)
                   (*(long *)(*(long *)&((lattice *)((long)this + 0x30))->deli +
                             (long)gtest_ar.message_.ptr_._4_4_ * 8) +
                   (long)(int)gtest_ar.message_.ptr_ * 8));
      errRHS = dVar3 + errRHS;
      dVar3 = sqr(RHS[gtest_ar.message_.ptr_._4_4_ + -1][(int)gtest_ar.message_.ptr_ + -1]);
      _j = dVar3 + _j;
    }
  }
  destroy2Dfield(in_stack_fffffffffffffe70,sizeX);
  destroy2Dfield(in_stack_fffffffffffffe70,sizeX);
  destroy2Dfield(in_stack_fffffffffffffe70,sizeX);
  destroy2Dfield(in_stack_fffffffffffffe70,sizeX);
  destroy2Dfield(in_stack_fffffffffffffe70,sizeX);
  destroy2Dfield(in_stack_fffffffffffffe70,sizeX);
  destroy2Dfield(in_stack_fffffffffffffe70,sizeX);
  local_c8 = 0.0001;
  testing::internal::CmpHelperLE<double,double>((internal *)local_c0,"errF","1e-4",&errG,&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/computationTest.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  testing::internal::CmpHelperLE<double,double>
            ((internal *)local_f8,"errG","1e-4",&errRHS,(double *)&stack0xffffffffffffff00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/computationTest.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  this_00 = (AssertionResult *)&stack0xfffffffffffffee0;
  testing::internal::CmpHelperLE<double,double>
            ((internal *)this_00,"errRHS","1e-4",(double *)&j,(double *)&stack0xfffffffffffffed8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffed0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&stack0xfffffffffffffee0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffec8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/computationTest.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffec8,(Message *)&stack0xfffffffffffffed0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffec8);
    testing::Message::~Message((Message *)&stack0xfffffffffffffed0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&stack0xfffffffffffffee0);
  return;
}

Assistant:

TEST_F(Computation, FG)
{
	REAL init[3] = {0.773,14.567,0};
	initUVP(&U,&V,&P,grid.deli,grid.delj,init);
	REAL **F = create2Dfield(grid.deli+1, grid.delj+1);
	REAL **G = create2Dfield(grid.deli+1, grid.delj+1);
	REAL **rhs = create2Dfield(grid.deli,grid.delj);
	char **FLAG = create2DIntegerField(grid.deli,grid.delj);

	fluidSim sim;
	sim.Re = 1000;
	sim.GX = 0;
	sim.GY = 0;
	sim.alpha = 0;
	compFG(U,V,F,G,FLAG,0.5,&grid,&sim);
	compRHS(F,G,rhs,&grid,0.5);
	REAL errF = 0, errG = 0, errRHS = 0;
	for (int i = 1; i <= grid.deli; i++)
		for (int j = 1; j <= grid.delj; j++)
		{
			errF += sqr(F[i-1][j] - U[i][j]);
			errG += sqr(G[i][j-1] - V[i][j]);
			errRHS += sqr(rhs[i-1][j-1]);
		}

	destroy2Dfield((void**)U,grid.deli+3);
	destroy2Dfield((void**)V,grid.deli+2);
	destroy2Dfield((void**)P,grid.deli+2);
	destroy2Dfield((void**)F,grid.deli+1);
	destroy2Dfield((void**)G,grid.deli+1);
	destroy2Dfield((void**)rhs,grid.deli);
	destroy2Dfield((void**)FLAG,grid.deli+2);

	EXPECT_LE(errF,1e-4);
	EXPECT_LE(errG,1e-4);
	EXPECT_LE(errRHS,1e-4);
}